

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain_tests.cpp
# Opt level: O1

void blockchain_tests::CheckGetPruneHeight(BlockManager *blockman,CChain *chain,int height)

{
  long lVar1;
  pointer ppCVar2;
  CBlockIndex *pCVar3;
  iterator in_R8;
  iterator pvVar4;
  iterator in_R9;
  iterator pvVar5;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string msg;
  const_string msg_00;
  check_type cVar6;
  undefined1 local_130 [16];
  undefined1 *local_120;
  char *local_118;
  undefined1 *local_110;
  undefined1 *local_108;
  char *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  char *local_d0;
  char *local_c8;
  int height_local;
  int *local_b8;
  assertion_result local_b0;
  int **local_98;
  optional<int> *local_90;
  lazy_ostream local_88;
  undefined1 *local_78;
  optional<int> **local_70;
  char *local_68;
  char *local_60;
  assertion_result local_58;
  optional<int> prune_height;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((height < 0) ||
     (ppCVar2 = (chain->vChain).super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                _M_impl.super__Vector_impl_data._M_start,
     (int)((ulong)((long)(chain->vChain).
                         super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)ppCVar2) >> 3) <= height)) {
    pCVar3 = (CBlockIndex *)0x0;
  }
  else {
    pCVar3 = ppCVar2[(uint)height];
  }
  for (; (pCVar3 != (CBlockIndex *)0x0 && (0 < pCVar3->nHeight)); pCVar3 = pCVar3->pprev) {
    *(byte *)&pCVar3->nStatus = (byte)pCVar3->nStatus & 0xf7;
  }
  height_local = height;
  prune_height = GetPruneHeight(blockman,chain);
  local_d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockchain_tests.cpp"
  ;
  local_c8 = "";
  local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar6 = 0x2d407d;
  file.m_end = (iterator)0x5e;
  file.m_begin = (iterator)&local_d0;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_e0,msg);
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)
       prune_height.super__Optional_base<int,_true,_true>._M_payload.
       super__Optional_payload_base<int>._M_engaged;
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_70 = (optional<int> **)local_130;
  local_130._0_8_ = "prune_height.has_value()";
  local_130._8_8_ = "";
  local_88.m_empty = false;
  local_88._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_78 = boost::unit_test::lazy_ostream::inst;
  local_f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockchain_tests.cpp"
  ;
  local_e8 = "";
  pvVar4 = (iterator)0x2;
  pvVar5 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_88,2,0,WARN,_cVar6,(size_t)&local_f0,0x5e);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  local_100 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockchain_tests.cpp"
  ;
  local_f8 = "";
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x5f;
  file_00.m_begin = (iterator)&local_100;
  msg_00.m_end = pvVar5;
  msg_00.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_110,
             msg_00);
  local_130._8_8_ = local_130._8_8_ & 0xffffffffffffff00;
  local_130._0_8_ = &PTR__lazy_ostream_013abb30;
  local_120 = boost::unit_test::lazy_ostream::inst;
  local_118 = "";
  local_90 = &prune_height;
  local_b8 = &height_local;
  local_58.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (prune_height.super__Optional_base<int,_true,_true>._M_payload.
        super__Optional_payload_base<int>._M_payload._M_value == height_local);
  local_58.m_message.px = (element_type *)0x0;
  local_58.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_68 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockchain_tests.cpp"
  ;
  local_60 = "";
  local_70 = &local_90;
  local_88.m_empty = false;
  local_88._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abcf0;
  local_78 = boost::unit_test::lazy_ostream::inst;
  local_98 = &local_b8;
  local_b0.m_message.px = (element_type *)((ulong)local_b0.m_message.px & 0xffffffffffffff00);
  local_b0._0_8_ = &PTR__lazy_ostream_013abcf0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion
            (&local_58,(lazy_ostream *)local_130,1,2,REQUIRE,0xe626d0,(size_t)&local_68,0x5f,
             &local_88,"height",&local_b0);
  boost::detail::shared_count::~shared_count(&local_58.m_message.pn);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(::cs_main)
{
    AssertLockHeld(::cs_main);

    // Emulate pruning all blocks from `height` down to the genesis block
    // by unsetting the `BLOCK_HAVE_DATA` flag from `nStatus`
    for (CBlockIndex* it{chain[height]}; it != nullptr && it->nHeight > 0; it = it->pprev) {
        it->nStatus &= ~BLOCK_HAVE_DATA;
    }

    const auto prune_height{GetPruneHeight(blockman, chain)};
    BOOST_REQUIRE(prune_height.has_value());
    BOOST_CHECK_EQUAL(*prune_height, height);
}